

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void finish_example(vw *all,audit_regressor_data *dd,example *ec)

{
  long lVar1;
  size_t ex_processed;
  undefined1 auVar2 [16];
  
  ex_processed = ec->example_counter + 1;
  if (((float)ex_processed < all->sd->dump_interval) || (all->quiet == true)) {
    if (dd->values_audited != dd->loaded_regressor_values) goto LAB_001e9940;
    print_ex(all,ex_processed,dd->values_audited,100);
  }
  else {
    print_ex(all,ex_processed,dd->values_audited,
             (dd->values_audited * 100) / dd->loaded_regressor_values);
    lVar1 = ec->example_counter + 1;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    all->sd->weighted_unlabeled_examples =
         (auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    shared_data::update_dump_interval(all->sd,all->progress_add,all->progress_arg);
    if (dd->values_audited != dd->loaded_regressor_values) goto LAB_001e9940;
  }
  set_done(all);
LAB_001e9940:
  VW::finish_example(all,ec);
  return;
}

Assistant:

void finish_example(vw& all, audit_regressor_data& dd, example& ec)
{
  bool printed = false;
  if (ec.example_counter + 1 >= all.sd->dump_interval && !all.quiet)
  {
    print_ex(all, ec.example_counter + 1, dd.values_audited, dd.values_audited * 100 / dd.loaded_regressor_values);
    all.sd->weighted_unlabeled_examples = (double)(ec.example_counter + 1);  // used in update_dump_interval
    all.sd->update_dump_interval(all.progress_add, all.progress_arg);
    printed = true;
  }

  if (dd.values_audited == dd.loaded_regressor_values)
  {
    // all regressor values were audited
    if (!printed)
      print_ex(all, ec.example_counter + 1, dd.values_audited, 100);
    set_done(all);
  }

  VW::finish_example(all, ec);
}